

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv6address.cpp
# Opt level: O2

RTPAddress * __thiscall
jrtplib::RTPIPv6Address::CreateCopy(RTPIPv6Address *this,RTPMemoryManager *mgr)

{
  uint16_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  RTPAddress *pRVar4;
  
  pRVar4 = (RTPAddress *)operator_new(0x20,mgr,0x17);
  uVar1 = this->port;
  uVar2 = *(undefined8 *)&(this->super_RTPAddress).field_0xc;
  uVar3 = *(undefined8 *)&this->field_0x14;
  pRVar4->addresstype = IPv6Address;
  pRVar4->_vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_00145b30;
  *(undefined8 *)&pRVar4->field_0xc = uVar2;
  *(undefined8 *)((long)&pRVar4[1]._vptr_RTPAddress + 4) = uVar3;
  *(uint16_t *)&pRVar4[1].field_0xc = uVar1;
  return pRVar4;
}

Assistant:

RTPAddress *RTPIPv6Address::CreateCopy(RTPMemoryManager *mgr) const
{
	JRTPLIB_UNUSED(mgr); // possibly unused
	RTPIPv6Address *newaddr = RTPNew(mgr,RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv6Address(ip,port);
	return newaddr;
}